

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBroker_impl.hpp
# Opt level: O1

bool __thiscall
helics::NetworkBroker<helics::ipc::IpcComms,_(gmlc::networking::InterfaceTypes)3,_5>::brokerConnect
          (NetworkBroker<helics::ipc::IpcComms,_(gmlc::networking::InterfaceTypes)3,_5> *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 in_ECX;
  socklen_t __len;
  sockaddr *__addr;
  milliseconds timeOut;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->dataMutex);
  if (iVar3 == 0) {
    if ((this->netInfo).brokerAddress._M_string_length == 0 &&
        (this->netInfo).brokerName._M_string_length == 0) {
      CoreBroker::setAsRoot((CoreBroker *)this);
    }
    bVar1 = (this->super_CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker>).super_CoreBroker.
            super_BrokerBase.observer;
    bVar2 = (this->super_CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker>).super_CoreBroker.
            super_BrokerBase.useJsonSerialization;
    __len = CONCAT31((int3)((uint)in_ECX >> 8),bVar2);
    (this->netInfo).useJsonSerialization = bVar2;
    (this->netInfo).observer = bVar1;
    CommsInterface::setName
              (&((this->super_CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker>).comms._M_t.
                 super___uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::ipc::IpcComms_*,_std::default_delete<helics::ipc::IpcComms>_>
                 .super__Head_base<0UL,_helics::ipc::IpcComms_*,_false>._M_head_impl)->
                super_CommsInterface,
               (string *)
               &(this->super_CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker>).
                super_CoreBroker.super_BrokerBase.identifier);
    ipc::IpcComms::loadNetworkInfo
              ((this->super_CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker>).comms._M_t.
               super___uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::ipc::IpcComms_*,_std::default_delete<helics::ipc::IpcComms>_>
               .super__Head_base<0UL,_helics::ipc::IpcComms_*,_false>._M_head_impl,&this->netInfo);
    timeOut.__r = (this->super_CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker>).
                  super_CoreBroker.super_BrokerBase.networkTimeout.internalTimeCode / 1000000;
    CommsInterface::setTimeout
              (&((this->super_CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker>).comms._M_t.
                 super___uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::ipc::IpcComms_*,_std::default_delete<helics::ipc::IpcComms>_>
                 .super__Head_base<0UL,_helics::ipc::IpcComms_*,_false>._M_head_impl)->
                super_CommsInterface,timeOut);
    iVar3 = CommsInterface::connect
                      (&((this->super_CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker>).comms.
                         _M_t.
                         super___uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::ipc::IpcComms_*,_std::default_delete<helics::ipc::IpcComms>_>
                         .super__Head_base<0UL,_helics::ipc::IpcComms_*,_false>._M_head_impl)->
                        super_CommsInterface,(int)timeOut.__r,__addr,__len);
    if ((SUB41(iVar3,0) != false) && ((this->netInfo).portNumber < 0)) {
      (this->netInfo).portNumber = -1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->dataMutex);
    return SUB41(iVar3,0);
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool NetworkBroker<COMMS, baseline, tcode>::brokerConnect()
{
    std::lock_guard<std::mutex> lock(dataMutex);
    if ((netInfo.brokerName.empty()) && (netInfo.brokerAddress.empty())) {
        CoreBroker::setAsRoot();
    }
    netInfo.useJsonSerialization = BrokerBase::useJsonSerialization;
    netInfo.observer = BrokerBase::observer;
    CommsBroker<COMMS, CoreBroker>::comms->setName(CoreBroker::getIdentifier());
    CommsBroker<COMMS, CoreBroker>::comms->loadNetworkInfo(netInfo);
    CommsBroker<COMMS, CoreBroker>::comms->setTimeout(BrokerBase::networkTimeout.to_ms());

    auto res = CommsBroker<COMMS, CoreBroker>::comms->connect();
    if (res) {
        if (netInfo.portNumber < 0) {
            netInfo.portNumber = CommsBroker<COMMS, CoreBroker>::comms->getPort();
        }
    }
    return res;
}